

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qplatformdialoghelper.cpp
# Opt level: O2

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QPlatformColorDialogHelper::*)(QColor_const&)>
                      ((QtMocHelpers *)_a,(void **)currentColorChanged,0,0);
    if (!bVar1) {
      QtMocHelpers::indexOfMethod<void(QPlatformColorDialogHelper::*)(QColor_const&)>
                ((QtMocHelpers *)_a,(void **)colorSelected,0,1);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      colorSelected((QPlatformColorDialogHelper *)_o,(QColor *)_a[1]);
      return;
    }
    if (_id == 0) {
      currentColorChanged((QPlatformColorDialogHelper *)_o,(QColor *)_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPlatformColorDialogHelper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentColorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 1: _t->colorSelected((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::currentColorChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::colorSelected, 1))
            return;
    }
}